

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O3

LY_ERR ly_dup_prefix_data(ly_ctx *ctx,LY_VALUE_FORMAT format,void *prefix_data,void **prefix_data_p)

{
  LY_ERR LVar1;
  long *plVar2;
  undefined8 *object;
  char *pcVar3;
  undefined8 *puVar4;
  size_t __n;
  LY_ERR LVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ly_set *ns_list;
  ly_set *local_38;
  
  if (*prefix_data_p != (void *)0x0) {
    __assert_fail("!*prefix_data_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                  ,0x581,
                  "LY_ERR ly_dup_prefix_data(const struct ly_ctx *, LY_VALUE_FORMAT, const void *, void **)"
                 );
  }
  LVar5 = LY_SUCCESS;
  LVar1 = LY_SUCCESS;
  switch(format) {
  case LY_VALUE_CANON:
  case LY_VALUE_JSON:
  case LY_VALUE_LYB:
    if (prefix_data != (void *)0x0) {
      __assert_fail("!prefix_data",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data_common.c"
                    ,0x5ad,
                    "LY_ERR ly_dup_prefix_data(const struct ly_ctx *, LY_VALUE_FORMAT, const void *, void **)"
                   );
    }
    prefix_data = (void *)0x0;
    LVar1 = LY_SUCCESS;
    break;
  case LY_VALUE_SCHEMA:
    break;
  case LY_VALUE_SCHEMA_RESOLVED:
    if (prefix_data == (void *)0x0) {
      plVar2 = (long *)calloc(1,8);
      if (plVar2 != (long *)0x0) {
        __n = 0;
        goto LAB_00128b49;
      }
    }
    else {
      plVar2 = (long *)calloc(1,*(long *)((long)prefix_data + -8) << 4 | 8);
      if (plVar2 != (long *)0x0) {
        __n = *(long *)((long)prefix_data + -8) << 4;
LAB_00128b49:
        memset(plVar2 + 1,0,__n);
        *prefix_data_p = plVar2 + 1;
        lVar8 = 1;
        lVar6 = 8;
        do {
          if (prefix_data == (void *)0x0) {
            uVar7 = 0;
          }
          else {
            uVar7 = *(ulong *)((long)prefix_data + -8);
          }
          if (uVar7 <= lVar8 - 1U) {
            return LY_SUCCESS;
          }
          pcVar3 = *(char **)((long)prefix_data + lVar6 + -8);
          if (pcVar3 != (char *)0x0) {
            pcVar3 = strdup(pcVar3);
            *(char **)((long)plVar2 + lVar6) = pcVar3;
            if (pcVar3 == (char *)0x0) break;
          }
          *(undefined8 *)((long)plVar2 + lVar6 + 8) = *(undefined8 *)((long)prefix_data + lVar6);
          *plVar2 = lVar8;
          lVar8 = lVar8 + 1;
          lVar6 = lVar6 + 0x10;
        } while( true );
      }
    }
LAB_00128be2:
    LVar1 = LY_EMEM;
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ly_dup_prefix_data");
    goto LAB_00128bf0;
  case LY_VALUE_XML:
  case LY_VALUE_STR_NS:
    LVar1 = ly_set_new(&local_38);
    if (LVar1 == LY_SUCCESS) {
      *prefix_data_p = local_38;
      if (*(int *)((long)prefix_data + 4) == 0) {
        return LY_SUCCESS;
      }
      uVar7 = 0;
      while (object = (undefined8 *)calloc(1,0x18), object != (undefined8 *)0x0) {
        LVar1 = ly_set_add(local_38,object,'\x01',(uint32_t *)0x0);
        if (LVar1 != LY_SUCCESS) goto LAB_00128bf0;
        lVar6 = *(long *)((long)prefix_data + 8);
        puVar4 = *(undefined8 **)(lVar6 + uVar7 * 8);
        if ((char *)*puVar4 != (char *)0x0) {
          pcVar3 = strdup((char *)*puVar4);
          *object = pcVar3;
          if (pcVar3 == (char *)0x0) break;
          puVar4 = *(undefined8 **)(lVar6 + uVar7 * 8);
        }
        pcVar3 = strdup((char *)puVar4[1]);
        object[1] = pcVar3;
        if (pcVar3 == (char *)0x0) break;
        uVar7 = uVar7 + 1;
        if (*(uint *)((long)prefix_data + 4) <= uVar7) {
          return LY_SUCCESS;
        }
      }
      goto LAB_00128be2;
    }
LAB_00128bf0:
    ly_free_prefix_data(format,*prefix_data_p);
    prefix_data = (void *)0x0;
    break;
  default:
    goto switchD_00128a18_default;
  }
  LVar5 = LVar1;
  *prefix_data_p = prefix_data;
switchD_00128a18_default:
  return LVar5;
}

Assistant:

LY_ERR
ly_dup_prefix_data(const struct ly_ctx *ctx, LY_VALUE_FORMAT format, const void *prefix_data,
        void **prefix_data_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyxml_ns *ns;
    struct lysc_prefix *prefixes = NULL, *orig_pref;
    struct ly_set *ns_list, *orig_ns;
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u;

    assert(!*prefix_data_p);

    switch (format) {
    case LY_VALUE_SCHEMA:
        *prefix_data_p = (void *)prefix_data;
        break;
    case LY_VALUE_SCHEMA_RESOLVED:
        /* copy all the value prefixes */
        orig_pref = (struct lysc_prefix *)prefix_data;
        LY_ARRAY_CREATE_GOTO(ctx, prefixes, LY_ARRAY_COUNT(orig_pref), ret, cleanup);
        *prefix_data_p = prefixes;

        LY_ARRAY_FOR(orig_pref, u) {
            if (orig_pref[u].prefix) {
                prefixes[u].prefix = strdup(orig_pref[u].prefix);
                LY_CHECK_ERR_GOTO(!prefixes[u].prefix, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            }
            prefixes[u].mod = orig_pref[u].mod;
            LY_ARRAY_INCREMENT(prefixes);
        }
        break;
    case LY_VALUE_XML:
    case LY_VALUE_STR_NS:
        /* copy all the namespaces */
        LY_CHECK_GOTO(ret = ly_set_new(&ns_list), cleanup);
        *prefix_data_p = ns_list;

        orig_ns = (struct ly_set *)prefix_data;
        for (i = 0; i < orig_ns->count; ++i) {
            ns = calloc(1, sizeof *ns);
            LY_CHECK_ERR_GOTO(!ns, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            LY_CHECK_GOTO(ret = ly_set_add(ns_list, ns, 1, NULL), cleanup);

            if (((struct lyxml_ns *)orig_ns->objs[i])->prefix) {
                ns->prefix = strdup(((struct lyxml_ns *)orig_ns->objs[i])->prefix);
                LY_CHECK_ERR_GOTO(!ns->prefix, LOGMEM(ctx); ret = LY_EMEM, cleanup);
            }
            ns->uri = strdup(((struct lyxml_ns *)orig_ns->objs[i])->uri);
            LY_CHECK_ERR_GOTO(!ns->uri, LOGMEM(ctx); ret = LY_EMEM, cleanup);
        }
        break;
    case LY_VALUE_CANON:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
        assert(!prefix_data);
        *prefix_data_p = NULL;
        break;
    }

cleanup:
    if (ret) {
        ly_free_prefix_data(format, *prefix_data_p);
        *prefix_data_p = NULL;
    }
    return ret;
}